

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O0

void ssh2_transport_gss_update(ssh2_transport_state *s,_Bool definitely_rekeying)

{
  LogContext *pLVar1;
  _Bool _Var2;
  int rekey_time;
  char *pcVar3;
  unsigned_long uVar4;
  double dVar5;
  unsigned_long *local_90;
  Ssh_gss_ctx local_60;
  Ssh_gss_ctx gss_ctx;
  Ssh_gss_buf gss_rcvtok;
  Ssh_gss_buf gss_sndtok;
  unsigned_long mins;
  time_t gss_cred_expiry;
  PacketProtocolLayer *pPStack_20;
  int gss_stat;
  PacketProtocolLayer *ppl;
  ssh2_transport_state *psStack_10;
  _Bool definitely_rekeying_local;
  ssh2_transport_state *s_local;
  
  pPStack_20 = &s->ppl;
  s->gss_status = 0;
  if ((s->shgss->libs->nlibraries != 0) &&
     ((ppl._7_1_ = definitely_rekeying, psStack_10 = s, _Var2 = conf_get_bool(s->conf,0x2a), _Var2
      || (_Var2 = conf_get_bool(psStack_10->conf,0x2b), _Var2)))) {
    if (psStack_10->shgss->srv_name == (Ssh_gss_name)0x0) {
      gss_cred_expiry._4_4_ =
           (*psStack_10->shgss->lib->import_name)
                     (psStack_10->shgss->lib,psStack_10->fullhostname,&psStack_10->shgss->srv_name);
      if (gss_cred_expiry._4_4_ != SSH_GSS_OK) {
        if (gss_cred_expiry._4_4_ == SSH_GSS_BAD_HOST_NAME) {
          pLVar1 = pPStack_20->logctx;
          pcVar3 = dupprintf(
                            "GSSAPI import name failed - Bad service name; won\'t use GSS key exchange"
                            );
          logevent_and_free(pLVar1,pcVar3);
          return;
        }
        pLVar1 = pPStack_20->logctx;
        pcVar3 = dupprintf("GSSAPI import name failed; won\'t use GSS key exchange");
        logevent_and_free(pLVar1,pcVar3);
        return;
      }
      gss_cred_expiry._4_4_ = 0;
    }
    gss_cred_expiry._4_4_ =
         (*psStack_10->shgss->lib->acquire_cred)(psStack_10->shgss->lib,&local_60,(time_t *)&mins);
    if (gss_cred_expiry._4_4_ == SSH_GSS_OK) {
      gss_rcvtok.value = (void *)0x0;
      gss_ctx = (Ssh_gss_ctx)0x0;
      gss_rcvtok.length = 0;
      if (mins == 0xffffffffffffffff) {
        local_90 = &mins;
      }
      else {
        local_90 = (unsigned_long *)0x0;
      }
      gss_cred_expiry._4_4_ =
           (*psStack_10->shgss->lib->init_sec_context)
                     (psStack_10->shgss->lib,&local_60,psStack_10->shgss->srv_name,0,
                      (Ssh_gss_buf *)&gss_ctx,(Ssh_gss_buf *)&gss_rcvtok.value,(time_t *)local_90,
                      &psStack_10->gss_ctxt_lifetime);
      if (local_60 != (Ssh_gss_ctx)0x0) {
        (*psStack_10->shgss->lib->release_cred)(psStack_10->shgss->lib,&local_60);
      }
      if ((gss_cred_expiry._4_4_ == SSH_GSS_OK) ||
         (gss_cred_expiry._4_4_ == SSH_GSS_S_CONTINUE_NEEDED)) {
        if (gss_rcvtok.value != (void *)0x0) {
          (*psStack_10->shgss->lib->free_tok)
                    (psStack_10->shgss->lib,(Ssh_gss_buf *)&gss_rcvtok.value);
        }
        psStack_10->gss_status = psStack_10->gss_status | 1;
        if (psStack_10->gss_ctxt_lifetime < 5) {
          psStack_10->gss_status = psStack_10->gss_status | 8;
        }
        _Var2 = conf_get_bool(psStack_10->conf,0x2c);
        if (_Var2) {
          if ((psStack_10->gss_cred_expiry != -1) &&
             (dVar5 = difftime(mins,psStack_10->gss_cred_expiry), 0.0 < dVar5)) {
            psStack_10->gss_status = psStack_10->gss_status | 2;
          }
          rekey_time = conf_get_int(psStack_10->conf,0x2d);
          uVar4 = sanitise_rekey_time(rekey_time,2);
          if ((uVar4 != 0) && (psStack_10->gss_ctxt_lifetime <= uVar4 * 0x3c)) {
            psStack_10->gss_status = psStack_10->gss_status | 4;
          }
        }
      }
      else if ((ppl._7_1_ & 1) != 0) {
        pLVar1 = pPStack_20->logctx;
        pcVar3 = dupprintf("No GSSAPI security context available");
        logevent_and_free(pLVar1,pcVar3);
      }
    }
  }
  return;
}

Assistant:

static void ssh2_transport_gss_update(struct ssh2_transport_state *s,
                                      bool definitely_rekeying)
{
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    int gss_stat;
    time_t gss_cred_expiry;
    unsigned long mins;
    Ssh_gss_buf gss_sndtok;
    Ssh_gss_buf gss_rcvtok;
    Ssh_gss_ctx gss_ctx;

    s->gss_status = 0;

    /*
     * Nothing to do if no GSSAPI libraries are configured or GSSAPI
     * auth is not enabled.
     */
    if (s->shgss->libs->nlibraries == 0)
        return;
    if (!conf_get_bool(s->conf, CONF_try_gssapi_auth) &&
        !conf_get_bool(s->conf, CONF_try_gssapi_kex))
        return;

    /* Import server name and cache it */
    if (s->shgss->srv_name == GSS_C_NO_NAME) {
        gss_stat = s->shgss->lib->import_name(
            s->shgss->lib, s->fullhostname, &s->shgss->srv_name);
        if (gss_stat != SSH_GSS_OK) {
            if (gss_stat == SSH_GSS_BAD_HOST_NAME)
                ppl_logevent("GSSAPI import name failed - Bad service name;"
                             " won't use GSS key exchange");
            else
                ppl_logevent("GSSAPI import name failed;"
                             " won't use GSS key exchange");
            return;
        }
    }

    /*
     * Do we (still) have credentials? Capture the credential
     * expiration when available
     */
    gss_stat = s->shgss->lib->acquire_cred(
        s->shgss->lib, &gss_ctx, &gss_cred_expiry);
    if (gss_stat != SSH_GSS_OK)
        return;

    SSH_GSS_CLEAR_BUF(&gss_sndtok);
    SSH_GSS_CLEAR_BUF(&gss_rcvtok);

    /*
     * When acquire_cred yields no useful expiration, get a proxy for
     * the cred expiration from the context expiration.
     */
    gss_stat = s->shgss->lib->init_sec_context(
        s->shgss->lib, &gss_ctx, s->shgss->srv_name,
        0 /* don't delegate */, &gss_rcvtok, &gss_sndtok,
        (gss_cred_expiry == GSS_NO_EXPIRATION ? &gss_cred_expiry : NULL),
        &s->gss_ctxt_lifetime);

    /* This context was for testing only. */
    if (gss_ctx)
        s->shgss->lib->release_cred(s->shgss->lib, &gss_ctx);

    if (gss_stat != SSH_GSS_OK &&
        gss_stat != SSH_GSS_S_CONTINUE_NEEDED) {
        /*
         * No point in verbosely interrupting the user to tell them we
         * couldn't get GSS credentials, if this was only a check
         * between key exchanges to see if fresh ones were available.
         * When we do do a rekey, this message (if displayed) will
         * appear among the standard rekey blurb, but when we're not,
         * it shouldn't pop up all the time regardless.
         */
        if (definitely_rekeying)
            ppl_logevent("No GSSAPI security context available");

        return;
    }

    if (gss_sndtok.length)
        s->shgss->lib->free_tok(s->shgss->lib, &gss_sndtok);

    s->gss_status |= GSS_KEX_CAPABLE;

    /*
     * When rekeying to cascade, avoid doing this too close to the
     * context expiration time, since the key exchange might fail.
     */
    if (s->gss_ctxt_lifetime < MIN_CTXT_LIFETIME)
        s->gss_status |= GSS_CTXT_MAYFAIL;

    /*
     * If we're not delegating credentials, rekeying is not used to
     * refresh them. We must avoid setting GSS_CRED_UPDATED or
     * GSS_CTXT_EXPIRES when credential delegation is disabled.
     */
    if (!conf_get_bool(s->conf, CONF_gssapifwd))
        return;

    if (s->gss_cred_expiry != GSS_NO_EXPIRATION &&
        difftime(gss_cred_expiry, s->gss_cred_expiry) > 0)
        s->gss_status |= GSS_CRED_UPDATED;

    mins = sanitise_rekey_time(
        conf_get_int(s->conf, CONF_gssapirekey), GSS_DEF_REKEY_MINS);
    if (mins > 0 && s->gss_ctxt_lifetime <= mins * 60)
        s->gss_status |= GSS_CTXT_EXPIRES;
}